

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::FileDescriptorProto::ByteSizeLong(FileDescriptorProto *this)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  InternalMetadataWithArena *metadata;
  size_t sVar5;
  RepeatedPtrField<google::protobuf::DescriptorProto> *in_RDI;
  int cached_size;
  size_t data_size_1;
  size_t data_size;
  FieldDescriptorProto *msg_3;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *__range2_3;
  ServiceDescriptorProto *msg_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *__range2_2;
  EnumDescriptorProto *msg_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *__range2_1;
  DescriptorProto *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<google::protobuf::DescriptorProto> *__range2;
  int n;
  int i;
  uint32 cached_has_bits;
  size_t total_size;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *in_stack_ffffffffffffff28;
  iterator local_c0;
  RepeatedPtrIterator<const_google::protobuf::FieldDescriptorProto> local_b8;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *local_b0;
  reference local_a8;
  iterator local_a0;
  RepeatedPtrIterator<const_google::protobuf::ServiceDescriptorProto> local_98;
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *local_90;
  reference local_88;
  iterator local_80;
  RepeatedPtrIterator<const_google::protobuf::EnumDescriptorProto> local_78;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *local_70;
  reference local_68;
  iterator local_60;
  RepeatedPtrIterator<const_google::protobuf::DescriptorProto> local_58;
  RepeatedPtrField<google::protobuf::DescriptorProto> *local_50;
  int local_44;
  int local_40;
  uint local_3c;
  size_t local_38;
  size_t local_28;
  int *local_20;
  undefined4 local_14;
  Rep **local_10;
  int *local_8;
  
  local_38 = 0;
  local_3c = 0;
  iVar3 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x51113b);
  sVar4 = internal::FromIntSize(iVar3);
  local_38 = sVar4 + local_38;
  local_40 = 0;
  local_44 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::size((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x51116e);
  for (; local_40 < local_44; local_40 = local_40 + 1) {
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Get((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
          (int)((ulong)in_RDI >> 0x20));
    sVar4 = internal::WireFormatLite::StringSize((string *)0x5111a1);
    local_38 = sVar4 + local_38;
  }
  iVar3 = _internal_message_type_size((FileDescriptorProto *)0x5111cd);
  local_38 = (long)iVar3 + local_38;
  local_50 = in_RDI + 2;
  local_58.it_ = (void **)RepeatedPtrField<google::protobuf::DescriptorProto>::begin(in_RDI);
  local_60.it_ = (void **)RepeatedPtrField<google::protobuf::DescriptorProto>::end
                                    ((RepeatedPtrField<google::protobuf::DescriptorProto> *)
                                     in_stack_ffffffffffffff28);
  while (bVar2 = internal::RepeatedPtrIterator<const_google::protobuf::DescriptorProto>::operator!=
                           (&local_58,&local_60), bVar2) {
    local_68 = internal::RepeatedPtrIterator<const_google::protobuf::DescriptorProto>::operator*
                         (&local_58);
    sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::DescriptorProto>
                      ((DescriptorProto *)0x51125d);
    local_38 = sVar4 + local_38;
    internal::RepeatedPtrIterator<const_google::protobuf::DescriptorProto>::operator++(&local_58);
  }
  iVar3 = _internal_enum_type_size((FileDescriptorProto *)0x511285);
  local_38 = (long)iVar3 + local_38;
  local_70 = (RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)in_RDI + 3;
  local_78.it_ = (void **)RepeatedPtrField<google::protobuf::EnumDescriptorProto>::begin
                                    ((RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)
                                     in_RDI);
  local_80.it_ = (void **)RepeatedPtrField<google::protobuf::EnumDescriptorProto>::end
                                    ((RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)
                                     in_stack_ffffffffffffff28);
  while (bVar2 = internal::RepeatedPtrIterator<const_google::protobuf::EnumDescriptorProto>::
                 operator!=(&local_78,&local_80), bVar2) {
    local_88 = internal::RepeatedPtrIterator<const_google::protobuf::EnumDescriptorProto>::operator*
                         (&local_78);
    sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::EnumDescriptorProto>
                      ((EnumDescriptorProto *)0x5112f7);
    local_38 = sVar4 + local_38;
    internal::RepeatedPtrIterator<const_google::protobuf::EnumDescriptorProto>::operator++
              (&local_78);
  }
  iVar3 = _internal_service_size((FileDescriptorProto *)0x51131c);
  local_38 = (long)iVar3 + local_38;
  local_90 = (RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)in_RDI + 4;
  local_98.it_ = (void **)RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::begin
                                    ((RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)
                                     in_RDI);
  local_a0.it_ = (void **)RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::end
                                    ((RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)
                                     in_stack_ffffffffffffff28);
  while (bVar2 = internal::RepeatedPtrIterator<const_google::protobuf::ServiceDescriptorProto>::
                 operator!=(&local_98,&local_a0), bVar2) {
    local_a8 = internal::RepeatedPtrIterator<const_google::protobuf::ServiceDescriptorProto>::
               operator*(&local_98);
    sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::ServiceDescriptorProto>
                      ((ServiceDescriptorProto *)0x51138e);
    local_38 = sVar4 + local_38;
    internal::RepeatedPtrIterator<const_google::protobuf::ServiceDescriptorProto>::operator++
              (&local_98);
  }
  iVar3 = _internal_extension_size((FileDescriptorProto *)0x5113b3);
  local_38 = (long)iVar3 + local_38;
  local_b0 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)in_RDI + 5;
  local_b8.it_ = (void **)RepeatedPtrField<google::protobuf::FieldDescriptorProto>::begin
                                    ((RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)
                                     in_RDI);
  local_c0.it_ = (void **)RepeatedPtrField<google::protobuf::FieldDescriptorProto>::end
                                    (in_stack_ffffffffffffff28);
  while (bVar2 = internal::RepeatedPtrIterator<const_google::protobuf::FieldDescriptorProto>::
                 operator!=(&local_b8,&local_c0), bVar2) {
    internal::RepeatedPtrIterator<const_google::protobuf::FieldDescriptorProto>::operator*
              (&local_b8);
    sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::FieldDescriptorProto>
                      ((FieldDescriptorProto *)0x511425);
    local_38 = sVar4 + local_38;
    internal::RepeatedPtrIterator<const_google::protobuf::FieldDescriptorProto>::operator++
              (&local_b8);
  }
  metadata = (InternalMetadataWithArena *)
             internal::WireFormatLite::Int32Size
                       ((RepeatedField<int> *)
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  iVar3 = _internal_public_dependency_size((FileDescriptorProto *)0x51145f);
  sVar4 = internal::FromIntSize(iVar3);
  local_38 = (long)&(metadata->
                    super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                    ).ptr_ + sVar4 + local_38;
  sVar4 = internal::WireFormatLite::Int32Size
                    ((RepeatedField<int> *)
                     CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  iVar3 = _internal_weak_dependency_size((FileDescriptorProto *)0x5114ad);
  sVar5 = internal::FromIntSize(iVar3);
  local_38 = sVar4 + sVar5 + local_38;
  local_10 = &(((RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)in_RDI)->
              super_RepeatedPtrFieldBase).rep_;
  local_14 = 0;
  local_3c = *(uint *)local_10;
  if ((local_3c & 0x1f) != 0) {
    if ((local_3c & 1) != 0) {
      _internal_name_abi_cxx11_((FileDescriptorProto *)0x511540);
      sVar5 = internal::WireFormatLite::StringSize((string *)0x511548);
      local_38 = sVar5 + 1 + local_38;
    }
    if ((local_3c & 2) != 0) {
      _internal_package_abi_cxx11_((FileDescriptorProto *)0x511574);
      sVar5 = internal::WireFormatLite::StringSize((string *)0x51157c);
      local_38 = sVar5 + 1 + local_38;
    }
    if ((local_3c & 4) != 0) {
      _internal_syntax_abi_cxx11_((FileDescriptorProto *)0x5115a8);
      sVar5 = internal::WireFormatLite::StringSize((string *)0x5115b0);
      local_38 = sVar5 + 1 + local_38;
    }
    if ((local_3c & 8) != 0) {
      sVar5 = internal::WireFormatLite::MessageSize<google::protobuf::FileOptions>
                        ((FileOptions *)0x5115e3);
      local_38 = sVar5 + 1 + local_38;
    }
    if ((local_3c & 0x10) != 0) {
      sVar5 = internal::WireFormatLite::MessageSize<google::protobuf::SourceCodeInfo>
                        ((SourceCodeInfo *)0x511616);
      local_38 = sVar5 + 1 + local_38;
    }
  }
  local_20 = &(((RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)in_RDI)->
              super_RepeatedPtrFieldBase).current_size_;
  uVar1 = (((RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)in_RDI)->
          super_RepeatedPtrFieldBase).current_size_;
  local_8 = local_20;
  if ((uVar1 & 1) == 1) {
    local_28 = internal::ComputeUnknownFieldsSize
                         (metadata,sVar4,
                          (CachedSize *)
                          CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  }
  else {
    iVar3 = internal::ToCachedSize(local_38);
    SetCachedSize((FileDescriptorProto *)CONCAT44(iVar3,in_stack_ffffffffffffff20),
                  (int)((ulong)in_RDI >> 0x20));
    local_28 = local_38;
  }
  return local_28;
}

Assistant:

size_t FileDescriptorProto::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.FileDescriptorProto)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated string dependency = 3;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(dependency_.size());
  for (int i = 0, n = dependency_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      dependency_.Get(i));
  }

  // repeated .google.protobuf.DescriptorProto message_type = 4;
  total_size += 1UL * this->_internal_message_type_size();
  for (const auto& msg : this->message_type_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
  total_size += 1UL * this->_internal_enum_type_size();
  for (const auto& msg : this->enum_type_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .google.protobuf.ServiceDescriptorProto service = 6;
  total_size += 1UL * this->_internal_service_size();
  for (const auto& msg : this->service_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 7;
  total_size += 1UL * this->_internal_extension_size();
  for (const auto& msg : this->extension_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated int32 public_dependency = 10;
  {
    size_t data_size = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      Int32Size(this->public_dependency_);
    total_size += 1 *
                  ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(this->_internal_public_dependency_size());
    total_size += data_size;
  }

  // repeated int32 weak_dependency = 11;
  {
    size_t data_size = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      Int32Size(this->weak_dependency_);
    total_size += 1 *
                  ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(this->_internal_weak_dependency_size());
    total_size += data_size;
  }

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x0000001fu) {
    // optional string name = 1;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_name());
    }

    // optional string package = 2;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_package());
    }

    // optional string syntax = 12;
    if (cached_has_bits & 0x00000004u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_syntax());
    }

    // optional .google.protobuf.FileOptions options = 8;
    if (cached_has_bits & 0x00000008u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *options_);
    }

    // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
    if (cached_has_bits & 0x00000010u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *source_code_info_);
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}